

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O3

void __thiscall
Jupiter::IRC::Client::partChannel(Client *this,string_view in_channel,string_view in_message)

{
  Socket *this_00;
  iterator iVar1;
  size_t sVar2;
  char *__n;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  string local_38;
  
  sVar2 = in_message._M_len;
  __n = in_channel._M_str;
  local_48._M_len = in_channel._M_len;
  this_00 = (this->m_socket)._M_t.
            super___uniq_ptr_impl<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>._M_t.
            super__Tuple_impl<0UL,_Jupiter::Socket_*,_std::default_delete<Jupiter::Socket>_>.
            super__Head_base<0UL,_Jupiter::Socket_*,_false>._M_head_impl;
  local_48._M_str = __n;
  string_printf_abi_cxx11_
            (&local_38,"PART %.*s :%.*s\r\n",local_48._M_len,__n,sVar2,in_message._M_str);
  Socket::send(this_00,(int)local_38._M_string_length,local_38._M_dataplus._M_p,(size_t)__n,
               (int)sVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  iVar1 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Jupiter::IRC::Client::Channel>,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::IRC::Client::Channel>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Jupiter::IRC::Client::Channel>,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::IRC::Client::Channel>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->m_channels,&local_48);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>,_false>
      ._M_cur != (__node_type *)0x0) {
    *(undefined4 *)
     ((long)iVar1.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>,_false>
            ._M_cur + 0x50) = 0xfffffffe;
  }
  return;
}

Assistant:

void Jupiter::IRC::Client::partChannel(std::string_view in_channel, std::string_view in_message) {
	m_socket->send(string_printf("PART %.*s :%.*s" ENDL, in_channel.size(), in_channel.data(), in_message.size(), in_message.data()));

	auto channel = m_channels.find(JUPITER_WRAP_MAP_KEY(in_channel));
	if (channel != m_channels.end()) {
		channel->second.setType(-2);
	}
}